

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stereo_calib.cpp
# Opt level: O1

void StereoCalib(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *imagelist,Size *boardSize,float squareSize,bool displayCorners,bool useCalibrated,
                bool showRectified)

{
  uchar **ppuVar1;
  long lVar2;
  uchar *puVar3;
  pointer pPVar4;
  pointer pPVar5;
  void *pvVar6;
  char cVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  ostream *poVar12;
  FileStorage *pFVar13;
  undefined8 uVar14;
  int iVar15;
  undefined7 in_register_00000011;
  ulong uVar16;
  long lVar17;
  Mat *this;
  int iVar18;
  double dVar19;
  pointer pbVar20;
  int iVar21;
  pointer pvVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  __m128d t;
  Mat *local_c40;
  Mat (*local_c38) [2];
  Mat *local_c28;
  long local_c18;
  double local_c10;
  _InputArray local_c08;
  undefined8 uStack_bf0;
  _InputArray local_be0;
  double local_bc8;
  undefined8 uStack_bc0;
  double local_bb0;
  double local_ba8;
  undefined8 uStack_ba0;
  ulong local_b90;
  double local_b88;
  int local_b80;
  int local_b7c;
  int local_b78 [3];
  int local_b6c;
  int local_b68 [3];
  int local_b5c;
  undefined4 local_b58;
  int local_b54;
  int local_b50;
  int local_b4c;
  undefined4 local_b48;
  int local_b44;
  int local_b40;
  int local_b3c;
  Mat rmap [2] [2];
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  objectPoints;
  Mat img_1;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  imagePoints [2];
  Mat R1;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  int local_898;
  int local_894;
  int local_890;
  int local_88c;
  Mat canvas;
  Mat rimg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  goodImageList;
  ulong local_7b0;
  ulong local_7a8 [4];
  Rect validRoi [2];
  Mat canvasPart_orig;
  Mat canvas_orig;
  Mat R;
  Mat distCoeffs [2];
  Mat canvasPart;
  vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> lines [2];
  _InputArray local_4e8;
  Mat cimg;
  Mat R2;
  FileStorage fs;
  Mat P1;
  Mat P2;
  Mat gimg;
  Mat Q;
  Mat cameraMatrix [2];
  Mat T;
  Mat F;
  Mat E;
  
  uVar25 = (long)(imagelist->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(imagelist->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if ((uVar25 & 0x20) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error: the image list contains odd (non-even) number of elements\n",0x41);
    return;
  }
  imagePoints[1].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imagePoints[1].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imagePoints[0].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imagePoints[1].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imagePoints[0].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imagePoints[0].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objectPoints.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objectPoints.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objectPoints.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar23 = (int)(uVar25 >> 5) >> 1;
  dVar19 = (double)(long)iVar23;
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints,(size_type)dVar19);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints + 1,(size_type)dVar19);
  local_b90 = CONCAT44(local_b90._4_4_,(int)CONCAT71(in_register_00000011,displayCorners));
  goodImageList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  goodImageList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  goodImageList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < iVar23) {
    dVar11 = 0.0;
    uVar9 = 0;
    iVar23 = 0;
    iVar15 = 0;
LAB_00104da5:
    local_ba8 = (double)(long)(int)uVar9;
    lVar17 = 0;
    local_bc8 = dVar11;
LAB_00104dc6:
    pbVar20 = (imagelist->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + lVar17 + (long)dVar11 * 2;
    cv::imread((string *)rmap,(int)pbVar20);
    cVar7 = cv::Mat::empty();
    if (cVar7 == '\0') {
      if (iVar15 == 0 && iVar23 == 0) {
        iVar23 = *rmap[0][0].size.p;
        iVar15 = rmap[0][0].size.p[1];
LAB_00104e40:
        pvVar22 = imagePoints[lVar17].
                  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_ba8;
        uVar10 = 1;
        do {
          cv::Mat::Mat(cameraMatrix);
          if (uVar10 == 1) {
            cv::Mat::operator=(cameraMatrix,rmap[0]);
          }
          else {
            distCoeffs[0].data = (uchar *)0x0;
            distCoeffs[0].flags = 0x1010000;
            distCoeffs[0]._8_8_ = rmap;
            R.data = (uchar *)0x0;
            R.flags = 0x2010000;
            local_7a8[3] = 0;
            R._8_8_ = cameraMatrix;
            cv::resize(distCoeffs,&R,local_7a8 + 3,5);
          }
          distCoeffs[0].data = (uchar *)0x0;
          distCoeffs[0].flags = 0x1010000;
          local_b40 = boardSize->width;
          local_b3c = boardSize->height;
          R.data = (uchar *)0x0;
          R.flags = -0x7dfcfff3;
          R._8_8_ = pvVar22;
          distCoeffs[0]._8_8_ = cameraMatrix;
          cVar7 = cv::findChessboardCorners(distCoeffs,&local_b40,&R);
          if (cVar7 == '\0') {
            cv::Mat::~Mat(cameraMatrix);
            if (1 < uVar10) goto LAB_001050a7;
          }
          else {
            if (uVar10 == 2) {
              distCoeffs[0].flags = 0x42ff400d;
              distCoeffs[0].dims = 2;
              uVar25 = (long)*(pointer *)
                              ((long)&pvVar22->
                                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              + 8) -
                       *(long *)&pvVar22->
                                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
              ;
              distCoeffs[0].cols = 1;
              distCoeffs[0].rows = (int)(uVar25 >> 3);
              distCoeffs[0].size.p = &distCoeffs[0].rows;
              distCoeffs[0].allocator = (MatAllocator *)0x0;
              distCoeffs[0].u = (UMatData *)0x0;
              distCoeffs[0].datalimit = (uchar *)0x0;
              distCoeffs[0].datastart = (uchar *)0x0;
              distCoeffs[0].step.p = distCoeffs[0].step.buf;
              distCoeffs[0].step.buf[0] = 0;
              distCoeffs[0].step.buf[1] = 0;
              pPVar4 = *(pointer *)
                        &pvVar22->
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>;
              if (pPVar4 != *(pointer *)
                             ((long)&pvVar22->
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             + 8)) {
                distCoeffs[0].step.buf[1] = 8;
                distCoeffs[0].step.buf[0] = 8;
                distCoeffs[0].datalimit =
                     (uchar *)((long)&pPVar4->x +
                              ((long)(uVar25 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U));
                distCoeffs[0].datastart = (uchar *)pPVar4;
              }
              R.data = (uchar *)0x0;
              R.flags = 0x2010000;
              R._8_8_ = distCoeffs;
              distCoeffs[0].data = distCoeffs[0].datastart;
              distCoeffs[0].dataend = distCoeffs[0].datalimit;
              cv::Mat::convertTo((_OutputArray *)distCoeffs,(int)&R,0.5,0.0);
              cv::Mat::~Mat(distCoeffs);
            }
            cv::Mat::~Mat(cameraMatrix);
            if (1 < uVar10 || cVar7 != '\0') goto LAB_001050a7;
          }
          uVar10 = uVar10 + 1;
        } while( true );
      }
      if ((rmap[0][0].size.p[1] == iVar15) && (*rmap[0][0].size.p == iVar23)) goto LAB_00104e40;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The image ",10);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(pbVar20->_M_dataplus)._M_p,
                           pbVar20->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," has the size different from the first image size. Skipping the pair\n",
                 0x45);
    }
    bVar27 = false;
    goto LAB_0010515a;
  }
  iVar15 = 0;
  iVar23 = 0;
  uVar9 = 0;
LAB_0010527b:
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12," pairs have been successfully detected.\n",0x28);
  if ((int)uVar9 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: too little pairs to run the calibration\n",0x2f);
    goto LAB_0010739d;
  }
  uVar16 = (ulong)uVar9;
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints,uVar16);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints + 1,uVar16);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::resize(&objectPoints,uVar16);
  uVar25 = 0;
  do {
    if (0 < boardSize->height) {
      iVar24 = 0;
      do {
        if (0 < boardSize->width) {
          iVar18 = 0;
          do {
            rmap[0][0].dims = (int)((float)iVar24 * squareSize);
            rmap[0][0].flags = (int)((float)iVar18 * squareSize);
            rmap[0][0]._8_8_ = rmap[0][0]._8_8_ & 0xffffffff00000000;
            std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
            emplace_back<cv::Point3_<float>>
                      ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)
                       (objectPoints.
                        super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar25),(Point3_<float> *)rmap);
            iVar18 = iVar18 + 1;
          } while (iVar18 < boardSize->width);
        }
        iVar24 = iVar24 + 1;
      } while (iVar24 < boardSize->height);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != uVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running stereo calibration ...\n",0x1f);
  lVar17 = 0;
  do {
    cv::Mat::Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&cameraMatrix[0].step + -3))->step + -3))->step
                               + 0xfffffffffffffffd) + lVar17));
    lVar17 = lVar17 + 0x60;
  } while (lVar17 != 0xc0);
  lVar17 = 0;
  do {
    cv::Mat::Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&distCoeffs[0].step + -3))->step + -3))->step +
                               0xfffffffffffffffd) + lVar17));
    lVar17 = lVar17 + 0x60;
  } while (lVar17 != 0xc0);
  R.data = (uchar *)0x0;
  R.flags = -0x7efbffeb;
  T.data = (uchar *)0x0;
  T.flags = -0x7efbfff3;
  T._8_8_ = imagePoints;
  R._8_8_ = &objectPoints;
  cv::initCameraMatrix2D(0,rmap);
  cv::Mat::operator=(cameraMatrix,rmap[0]);
  cv::Mat::~Mat(rmap[0]);
  R.data = (uchar *)0x0;
  R.flags = -0x7efbffeb;
  T.data = (uchar *)0x0;
  T.flags = -0x7efbfff3;
  T._8_8_ = imagePoints + 1;
  R._8_8_ = &objectPoints;
  cv::initCameraMatrix2D(0,rmap);
  cv::Mat::operator=(cameraMatrix + 1,rmap[0]);
  cv::Mat::~Mat(rmap[0]);
  cv::Mat::Mat(&R);
  cv::Mat::Mat(&T);
  cv::Mat::Mat(&E);
  cv::Mat::Mat(&F);
  rmap[0][0].data = (uchar *)0x0;
  rmap[0][0].flags = -0x7efbffeb;
  rmap[0][0]._8_8_ = &objectPoints;
  R1.data = (uchar *)0x0;
  R1.flags = -0x7efbfff3;
  R1._8_8_ = imagePoints;
  R2.data = (uchar *)0x0;
  R2.flags = -0x7efbfff3;
  R2._8_8_ = imagePoints + 1;
  P1.data = (uchar *)0x0;
  P1.flags = 0x3010000;
  P1._8_8_ = cameraMatrix;
  P2.data = (uchar *)0x0;
  P2.flags = 0x3010000;
  P2._8_8_ = distCoeffs;
  Q.data = (uchar *)0x0;
  Q.flags = 0x3010000;
  canvas._8_8_ = distCoeffs + 1;
  canvas.data = (uchar *)0x0;
  canvas.flags = 0x3010000;
  canvas_orig.data = (uchar *)0x0;
  canvas_orig.flags = 0x2010000;
  img_1.data = (uchar *)0x0;
  img_1.flags = 0x2010000;
  rimg.data = (uchar *)0x0;
  rimg.flags = 0x2010000;
  cimg.data = (uchar *)0x0;
  cimg.flags = 0x2010000;
  canvas_orig._8_8_ = &R;
  img_1._8_8_ = &T;
  rimg._8_8_ = &E;
  cimg._8_8_ = &F;
  Q._8_8_ = cameraMatrix + 1;
  dVar19 = (double)cv::stereoCalibrate(rmap,&R1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"done with RMS error=",0x14);
  poVar12 = std::ostream::_M_insert<double>(dVar19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  lines[1].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lines[1].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines[0].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines[1].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines[0].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines[0].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b88 = 4.94065645841247e-324;
  if (1 < (int)uVar9) {
    local_b88 = (double)(ulong)uVar9;
  }
  local_c10 = 0.0;
  dVar19 = 0.0;
  iVar24 = 0;
  do {
    local_bb0 = (double)CONCAT44(local_bb0._4_4_,iVar24);
    local_ba8 = (double)((ulong)((long)imagePoints[0].
                                       super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar19].
                                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)imagePoints[0].
                                      super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(long)dVar19].
                                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
    lVar17 = 0;
    local_bc8 = dVar19;
    do {
      cv::Mat::Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                          lVar17 + 0xffffffffffffffb8U));
      lVar17 = lVar17 + 0x60;
    } while (lVar17 != 0xc0);
    iVar24 = 1;
    this = rmap[0];
    local_c28 = cameraMatrix;
    local_c40 = distCoeffs;
    lVar17 = 0;
    do {
      lVar2 = *(long *)((long)&imagePoints[0].
                               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17);
      R1.flags = 0x42ff400d;
      R1.dims = 2;
      uVar25 = *(long *)(lVar2 + 8 + (long)dVar19 * 0x18) - *(long *)(lVar2 + (long)dVar19 * 0x18);
      R1.cols = 1;
      R1.rows = (int)(uVar25 >> 3);
      R1.allocator = (MatAllocator *)0x0;
      R1.u = (UMatData *)0x0;
      R1.datalimit = (uchar *)0x0;
      R1.datastart = (uchar *)0x0;
      R1.size.p = &R1.rows;
      R1.step.p = R1.step.buf;
      R1.step.buf[0] = 0;
      R1.step.buf[1] = 0;
      puVar3 = *(uchar **)(lVar2 + (long)dVar19 * 0x18);
      if (puVar3 != *(uchar **)(lVar2 + 8 + (long)dVar19 * 0x18)) {
        R1.step.buf[1] = 8;
        R1.step.buf[0] = 8;
        R1.datalimit = puVar3 + ((long)(uVar25 * 0x20000000) >> 0x1d & 0xfffffffffffffff8);
        R1.datastart = puVar3;
      }
      R1.data = R1.datastart;
      R1.dataend = R1.datalimit;
      cv::Mat::operator=(this,&R1);
      cv::Mat::~Mat(&R1);
      R2.data = (uchar *)0x0;
      R2.flags = 0x1010000;
      P1.data = (uchar *)0x0;
      P1.flags = 0x2010000;
      P2.data = (uchar *)0x0;
      P2.flags = 0x1010000;
      P2._8_8_ = local_c28;
      Q.data = (uchar *)0x0;
      Q.flags = 0x1010000;
      Q._8_8_ = local_c40;
      R2._8_8_ = this;
      P1._8_8_ = this;
      cv::Mat::Mat(&R1);
      canvas.data = (uchar *)0x0;
      canvas.flags = 0x1010000;
      canvas_orig.data = (uchar *)0x0;
      canvas_orig.flags = 0x1010000;
      canvas_orig._8_8_ = local_c28;
      canvas._8_8_ = &R1;
      cv::undistortPoints((_InputArray *)&R2,(_OutputArray *)&P1,(_InputArray *)&P2,
                          (_InputArray *)&Q,(_InputArray *)&canvas,(_InputArray *)&canvas_orig);
      cv::Mat::~Mat(&R1);
      R1.data = (uchar *)0x0;
      R1.flags = 0x1010000;
      R2.data = (uchar *)0x0;
      R2.flags = 0x1010000;
      R2._8_8_ = &F;
      P1._8_8_ = (long)&lines[0].
                        super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar17;
      P1.data = (uchar *)0x0;
      P1.flags = -0x7dfcffeb;
      R1._8_8_ = this;
      cv::computeCorrespondEpilines
                ((_InputArray *)&R1,iVar24,(_InputArray *)&R2,(_OutputArray *)&P1);
      lVar17 = lVar17 + 0x18;
      local_c40 = local_c40 + 1;
      local_c28 = local_c28 + 1;
      this = this + 1;
      iVar24 = iVar24 + 1;
    } while (lVar17 == 0x18);
    iVar24 = local_bb0._0_4_;
    if (0 < (int)SUB84(local_ba8,0)) {
      pPVar4 = imagePoints[0].
               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)local_bc8].
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar5 = imagePoints[1].
               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)local_bc8].
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = 8;
      uVar25 = 0;
      do {
        local_c10 = local_c10 +
                    (double)(ABS(pPVar5[uVar25].x *
                                 *(float *)(lines[0].
                                            super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8)
                                 + pPVar5[uVar25].y *
                                   *(float *)(lines[0].
                                              super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                             lVar17 + -4) +
                                 *(float *)(lines[0].
                                            super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar17)) +
                            ABS(pPVar4[uVar25].x *
                                *(float *)(lines[1].
                                           super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8)
                                + pPVar4[uVar25].y *
                                  *(float *)(lines[1].
                                             super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar17 + -4
                                            ) +
                                *(float *)(lines[1].
                                           super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar17)));
        uVar25 = uVar25 + 1;
        lVar17 = lVar17 + 0xc;
      } while ((SUB84(local_ba8,0) & 0x7fffffff) != uVar25);
    }
    lVar17 = 0x60;
    do {
      cv::Mat::~Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                           lVar17 + 0xffffffffffffffb8U));
      lVar17 = lVar17 + -0x60;
    } while (lVar17 != -0x60);
    iVar24 = iVar24 + local_ba8._0_4_;
    dVar19 = (double)((long)local_bc8 + 1);
  } while (dVar19 != local_b88);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"average epipolar err = ",0x17);
  poVar12 = std::ostream::_M_insert<double>(local_c10 / (double)iVar24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  ppuVar1 = &rmap[0][0].data;
  rmap[0][0]._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"intrinsics.yml","");
  R1.rows = 0;
  R1.cols = 0;
  R1.data = (uchar *)((ulong)R1.data & 0xffffffffffffff00);
  R1._0_8_ = &R1.data;
  cv::FileStorage::FileStorage(&fs,(string *)rmap,1,(string *)&R1);
  if ((uchar **)R1._0_8_ != &R1.data) {
    operator_delete((void *)R1._0_8_);
  }
  if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
    operator_delete((void *)rmap[0][0]._0_8_);
  }
  cVar7 = cv::FileStorage::isOpened();
  if (cVar7 != '\0') {
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"M1","");
    pFVar13 = (FileStorage *)cv::operator<<(&fs,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 == '\0') {
LAB_00105d64:
      rmap[0][0]._0_8_ = ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"D1","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar7 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010742c;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),distCoeffs);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"M2","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar7 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_00107470;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),cameraMatrix + 1);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"D2","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar7 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_001074b4;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),distCoeffs + 1);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      cv::FileStorage::release();
      goto LAB_00105f05;
    }
    if (*(int *)(pFVar13 + 8) != 6) {
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),cameraMatrix);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
      goto LAB_00105d64;
    }
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_0010742c:
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_00107470:
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_001074b4:
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_001074f8:
    rmap[0][0]._0_8_ = &rmap[0][0].data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_0010753c:
    rmap[0][0]._0_8_ = &rmap[0][0].data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_00107580:
    rmap[0][0]._0_8_ = &rmap[0][0].data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_001075c4:
    rmap[0][0]._0_8_ = &rmap[0][0].data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_00107608:
    rmap[0][0]._0_8_ = &rmap[0][0].data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_0010764c:
    rmap[0][0]._0_8_ = &rmap[0][0].data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",
              0x4c8);
LAB_00107690:
    rmap[0][0]._0_8_ = &rmap[0][0].data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)rmap,"No element name has been given","");
    uVar14 = cv::error(-2,(string *)rmap,"operator<<",
                       "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
    if ((uchar **)rmap[0][0]._0_8_ != &rmap[0][0].data) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cv::Mat::~Mat(&Q);
    cv::Mat::~Mat(&P2);
    cv::Mat::~Mat(&P1);
    cv::Mat::~Mat(&R2);
    cv::Mat::~Mat(&R1);
    cv::FileStorage::~FileStorage(&fs);
    lVar17 = 0x18;
    do {
      pvVar6 = *(void **)((long)&lines[0].
                                 super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar17);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6);
      }
      lVar17 = lVar17 + -0x18;
    } while (lVar17 != -0x18);
    cv::Mat::~Mat(&F);
    cv::Mat::~Mat(&E);
    cv::Mat::~Mat(&T);
    cv::Mat::~Mat(&R);
    lVar17 = 0x60;
    do {
      cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&distCoeffs[0].step + -3))->step + -3))->step
                                  + 0xfffffffffffffffd) + lVar17));
      lVar17 = lVar17 + -0x60;
    } while (lVar17 != -0x60);
    lVar17 = 0x60;
    do {
      cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&cameraMatrix[0].step + -3))->step + -3))->
                                    step + 0xfffffffffffffffd) + lVar17));
      lVar17 = lVar17 + -0x60;
    } while (lVar17 != -0x60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&goodImageList);
    std::
    vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ::~vector(&objectPoints);
    lVar17 = 0x18;
    do {
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::~vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 *)((long)&imagePoints[0].
                           super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar17));
      lVar17 = lVar17 + -0x18;
    } while (lVar17 != -0x18);
    _Unwind_Resume(uVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error: can not save the intrinsic parameters\n",0x2d);
LAB_00105f05:
  cv::Mat::Mat(&R1);
  cv::Mat::Mat(&R2);
  cv::Mat::Mat(&P1);
  cv::Mat::Mat(&P2);
  cv::Mat::Mat(&Q);
  validRoi[1].x = 0;
  validRoi[1].y = 0;
  validRoi[1].width = 0;
  validRoi[1].height = 0;
  validRoi[0].x = 0;
  validRoi[0].y = 0;
  validRoi[0].width = 0;
  validRoi[0].height = 0;
  rmap[0][0].data = (uchar *)0x0;
  rmap[0][0].flags = 0x1010000;
  rmap[0][0]._8_8_ = cameraMatrix;
  canvas.data = (uchar *)0x0;
  canvas.flags = 0x1010000;
  canvas._8_8_ = distCoeffs;
  canvas_orig.data = (uchar *)0x0;
  canvas_orig.flags = 0x1010000;
  canvas_orig._8_8_ = cameraMatrix + 1;
  img_1.data = (uchar *)0x0;
  img_1.flags = 0x1010000;
  img_1._8_8_ = distCoeffs + 1;
  rimg.data = (uchar *)0x0;
  rimg.flags = 0x1010000;
  rimg._8_8_ = &R;
  cimg.data = (uchar *)0x0;
  cimg.flags = 0x1010000;
  cimg._8_8_ = &T;
  gimg.data = (uchar *)0x0;
  gimg.flags = 0x2010000;
  canvasPart.data = (uchar *)0x0;
  canvasPart.flags = 0x2010000;
  canvasPart_orig.data = (uchar *)0x0;
  canvasPart_orig.flags = 0x2010000;
  local_c08.sz.width = 0;
  local_c08.sz.height = 0;
  local_c08.flags = 0x2010000;
  local_be0.sz.width = 0;
  local_be0.sz.height = 0;
  local_be0.flags = 0x2010000;
  gimg._8_8_ = &R1;
  canvasPart._8_8_ = &R2;
  local_c08.obj = &P2;
  local_be0.obj = &Q;
  canvasPart_orig._8_8_ = &P1;
  cv::stereoRectify(0);
  ppuVar1 = &rmap[0][0].data;
  rmap[0][0]._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"extrinsics.yml","");
  canvas.rows = 0;
  canvas.cols = 0;
  canvas.data = (uchar *)((ulong)canvas.data & 0xffffffffffffff00);
  canvas._0_8_ = &canvas.data;
  cv::FileStorage::open((string *)&fs,(int)rmap,(string *)0x1);
  if ((uchar **)canvas._0_8_ != &canvas.data) {
    operator_delete((void *)canvas._0_8_);
  }
  if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
    operator_delete((void *)rmap[0][0]._0_8_);
  }
  cVar7 = cv::FileStorage::isOpened();
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: can not save the extrinsic parameters\n",0x2d);
  }
  else {
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"R","");
    pFVar13 = (FileStorage *)cv::operator<<(&fs,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_001074f8;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),&R);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"T","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010753c;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),&T);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"R1","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_00107580;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),&R1);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"R2","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_001075c4;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),&R2);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"P1","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_00107608;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),&P1);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"P2","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010764c;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),&P2);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"Q","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar1) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar7 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar7 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_00107690;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),&Q);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    cv::FileStorage::release();
  }
  if ((char)local_b90 != '\0') {
    local_ba8 = ABS(*(double *)(P2.data + *P2.step.p + 0x18));
    uStack_ba0 = 0;
    local_bc8 = ABS(*(double *)(P2.data + 0x18));
    uStack_bc0 = 0;
    lVar17 = 0;
    do {
      cv::Mat::Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                          lVar17 + 0xffffffffffffffb8U));
      lVar17 = lVar17 + 0x60;
    } while (lVar17 != 0x180);
    canvas.data = (uchar *)0x0;
    canvas.flags = 0x1010000;
    canvas._8_8_ = cameraMatrix;
    canvas_orig.data = (uchar *)0x0;
    canvas_orig.flags = 0x1010000;
    canvas_orig._8_8_ = distCoeffs;
    img_1.data = (uchar *)0x0;
    img_1.flags = 0x1010000;
    img_1._8_8_ = &R1;
    rimg.data = (uchar *)0x0;
    rimg.flags = 0x1010000;
    rimg._8_8_ = &P1;
    cimg.data = (uchar *)0x0;
    cimg.flags = 0x2010000;
    cimg._8_8_ = rmap;
    gimg._8_8_ = rmap[0] + 1;
    gimg.data = (uchar *)0x0;
    gimg.flags = 0x2010000;
    cv::initUndistortRectifyMap();
    canvas.data = (uchar *)0x0;
    canvas.flags = 0x1010000;
    canvas._8_8_ = cameraMatrix + 1;
    canvas_orig.data = (uchar *)0x0;
    canvas_orig.flags = 0x1010000;
    canvas_orig._8_8_ = distCoeffs + 1;
    img_1.data = (uchar *)0x0;
    img_1.flags = 0x1010000;
    img_1._8_8_ = &R2;
    rimg.data = (uchar *)0x0;
    rimg.flags = 0x1010000;
    rimg._8_8_ = &P2;
    cimg._8_8_ = rmap + 1;
    cimg.data = (uchar *)0x0;
    cimg.flags = 0x2010000;
    gimg._8_8_ = rmap[1] + 1;
    gimg.data = (uchar *)0x0;
    gimg.flags = 0x2010000;
    cv::initUndistortRectifyMap();
    cv::Mat::Mat(&canvas);
    cv::Mat::Mat(&canvas_orig);
    iVar24 = iVar23;
    if (iVar23 < iVar15) {
      iVar24 = iVar15;
    }
    if (local_ba8 <= local_bc8) {
      local_bb0 = 600.0 / (double)iVar24;
      iVar15 = (int)ROUND((double)iVar15 * local_bb0);
      iVar23 = (int)ROUND((double)iVar23 * local_bb0);
      cv::Mat::create((int)&canvas,iVar23,iVar15 * 2);
      cv::Mat::create((int)&canvas_orig,iVar23,iVar15 * 2);
    }
    else {
      local_bb0 = 300.0 / (double)iVar24;
      iVar15 = (int)ROUND((double)iVar15 * local_bb0);
      iVar23 = (int)ROUND((double)iVar23 * local_bb0);
      cv::Mat::create((int)&canvas,iVar23 * 2,iVar15);
      cv::Mat::create((int)&canvas_orig,iVar23 * 2,iVar15);
    }
    uVar25 = (ulong)uVar9;
    if ((int)uVar9 < 2) {
      uVar25 = 1;
    }
    dVar19 = 0.0;
    uVar16 = 0;
    do {
      local_c38 = rmap;
      local_c18 = 0;
      uVar10 = 0;
      uVar9 = 0;
      local_b90 = uVar16;
      local_b88 = dVar19;
      do {
        cv::imread((string *)&img_1,
                   (int)goodImageList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + SUB84(dVar19,0));
        cv::Mat::Mat(&rimg);
        cv::Mat::Mat(&cimg);
        cv::Mat::Mat(&gimg);
        canvasPart_orig.data = (uchar *)0x0;
        canvasPart_orig.flags = 0x1010000;
        local_c08.sz.width = 0;
        local_c08.sz.height = 0;
        local_c08.flags = 0x2010000;
        local_be0.sz.width = 0;
        local_be0.sz.height = 0;
        local_be0.flags = 0x1010000;
        local_be0.obj = local_c38;
        local_4e8.obj = *local_c38 + 1;
        local_4e8.sz.width = 0;
        local_4e8.sz.height = 0;
        local_4e8.flags = 0x1010000;
        canvasPart.data = (uchar *)0x0;
        canvasPart.datastart = (uchar *)0x0;
        canvasPart.flags = 0;
        canvasPart.dims = 0;
        canvasPart.rows = 0;
        canvasPart.cols = 0;
        iVar24 = 1;
        local_c08.obj = &rimg;
        canvasPart_orig._8_8_ = &img_1;
        cv::remap((_InputArray *)&canvasPart_orig,(_OutputArray *)&local_c08,&local_be0,&local_4e8,1
                  ,0,(Scalar_ *)&canvasPart);
        canvasPart.data = (uchar *)0x0;
        canvasPart.flags = 0x1010000;
        canvasPart_orig.data = (uchar *)0x0;
        canvasPart_orig.flags = 0x2010000;
        canvasPart_orig._8_8_ = &cimg;
        canvasPart._8_8_ = &rimg;
        cv::cvtColor((cv *)&canvasPart,(_InputArray *)&canvasPart_orig,(_OutputArray *)0x8,0,iVar24)
        ;
        canvasPart.data = (uchar *)0x0;
        canvasPart.flags = 0x1010000;
        canvasPart_orig.data = (uchar *)0x0;
        canvasPart_orig.flags = 0x2010000;
        canvasPart_orig._8_8_ = &gimg;
        canvasPart._8_8_ = &img_1;
        cv::cvtColor((cv *)&canvasPart,(_InputArray *)&canvasPart_orig,(_OutputArray *)0x8,0,iVar24)
        ;
        if (local_ba8 <= local_bc8) {
          canvasPart_orig.dims = 0;
          canvasPart_orig.cols = iVar23;
          canvasPart_orig.rows = iVar15;
          canvasPart_orig.flags = uVar10;
          cv::Mat::Mat(&canvasPart,&canvas,(Rect_ *)&canvasPart_orig);
        }
        else {
          local_c08._0_8_ = (ulong)uVar9 << 0x20;
          local_c08.obj = (void *)CONCAT44(iVar23,iVar15);
          cv::Mat::Mat(&canvasPart,&canvas,(Rect_ *)&local_c08);
        }
        if (local_ba8 <= local_bc8) {
          local_c08._4_4_ = 0;
          local_c08.flags = uVar10;
          local_c08.obj = (void *)CONCAT44(iVar23,iVar15);
          cv::Mat::Mat(&canvasPart_orig,&canvas_orig,(Rect_ *)&local_c08);
        }
        else {
          local_be0.flags = 0;
          local_be0.obj = (void *)CONCAT44(iVar23,iVar15);
          local_be0._4_4_ = uVar9;
          cv::Mat::Mat(&canvasPart_orig,&canvas_orig,(Rect_ *)&local_be0);
        }
        local_c08.sz.width = 0;
        local_c08.sz.height = 0;
        local_c08.flags = 0x1010000;
        local_be0.sz.width = 0;
        local_be0.sz.height = 0;
        local_be0.flags = 0x2010000;
        local_7a8[0] = *(ulong *)canvasPart.size.p << 0x20 | *(ulong *)canvasPart.size.p >> 0x20;
        local_c08.obj = &cimg;
        local_be0.obj = &canvasPart;
        cv::resize(0,0,&local_c08,&local_be0,local_7a8,3);
        local_c08.sz.width = 0;
        local_c08.sz.height = 0;
        local_c08.flags = 0x1010000;
        local_be0.sz.width = 0;
        local_be0.sz.height = 0;
        local_be0.flags = 0x2010000;
        local_be0.obj = &canvasPart_orig;
        local_7b0 = *(ulong *)canvasPart_orig.size.p << 0x20 |
                    *(ulong *)canvasPart_orig.size.p >> 0x20;
        local_c08.obj = &gimg;
        cv::resize(0,0,&local_c08,&local_be0,&local_7b0,3);
        iVar24 = (int)ROUND((double)*(int *)((long)&validRoi[0].x + local_c18) * local_bb0);
        iVar18 = (int)ROUND((double)*(int *)((long)&validRoi[0].y + local_c18) * local_bb0);
        iVar21 = (int)ROUND((double)*(int *)((long)&validRoi[0].width + local_c18) * local_bb0);
        iVar26 = (int)ROUND((double)*(int *)((long)&validRoi[0].height + local_c18) * local_bb0);
        local_be0.sz.width = 0;
        local_be0.sz.height = 0;
        local_be0.flags = 0x3010000;
        local_be0.obj = &canvasPart;
        local_c08.flags = 0;
        local_c08._4_4_ = 0;
        local_c08.obj = (void *)0x0;
        local_c08.sz.width = 0;
        local_c08.sz.height = 0x406fe000;
        uStack_bf0 = 0;
        local_898 = iVar24;
        local_894 = iVar18;
        local_890 = iVar21;
        local_88c = iVar26;
        cv::rectangle(&local_be0,&local_898,&local_c08,3,8);
        local_be0.sz.width = 0;
        local_be0.sz.height = 0;
        local_be0.flags = 0x3010000;
        local_c08.flags = 0;
        local_c08._4_4_ = 0;
        local_c08.obj = (Mat *)0x0;
        local_c08.sz.width = 0;
        local_c08.sz.height = 0x406fe000;
        uStack_bf0 = 0;
        local_be0.obj = &canvasPart_orig;
        local_8a8 = iVar24;
        local_8a4 = iVar18;
        local_8a0 = iVar21;
        local_89c = iVar26;
        cv::rectangle(&local_be0,&local_8a8,&local_c08,3,8);
        cv::Mat::~Mat(&canvasPart_orig);
        cv::Mat::~Mat(&canvasPart);
        cv::Mat::~Mat(&gimg);
        cv::Mat::~Mat(&cimg);
        cv::Mat::~Mat(&rimg);
        cv::Mat::~Mat(&img_1);
        uVar9 = uVar9 + iVar23;
        uVar10 = uVar10 + iVar15;
        dVar19 = (double)((long)dVar19 + 0x20);
        local_c18 = local_c18 + 0x10;
        local_c38 = local_c38 + 1;
      } while (local_c18 == 0x10);
      if (local_ba8 <= local_bc8) {
        if (0 < canvas.rows) {
          iVar24 = 0;
          do {
            rimg.data = (uchar *)0x0;
            rimg.flags = 0x3010000;
            rimg._8_8_ = &canvas;
            local_b48 = 0;
            local_b50 = canvas.cols;
            img_1.flags = 0;
            img_1.dims = 0;
            img_1.rows = 0;
            img_1.cols = 0x406fe000;
            img_1.data = (uchar *)0x0;
            img_1.datastart = (uchar *)0x0;
            local_b4c = iVar24;
            local_b44 = iVar24;
            cv::line(&rimg,&local_b48,&local_b50,&img_1,1,8,0);
            rimg.data = (uchar *)0x0;
            rimg.flags = 0x3010000;
            rimg._8_8_ = &canvas_orig;
            local_b58 = 0;
            local_b68[2] = canvas_orig.cols;
            img_1.flags = 0;
            img_1.dims = 0;
            img_1.rows = 0;
            img_1.cols = 0x406fe000;
            img_1.data = (uchar *)0x0;
            img_1.datastart = (uchar *)0x0;
            local_b5c = iVar24;
            local_b54 = iVar24;
            cv::line(&rimg,&local_b58,local_b68 + 2,&img_1,1,8,0);
            iVar24 = iVar24 + 0x10;
          } while (iVar24 < canvas.rows);
        }
      }
      else if (0 < canvas.cols) {
        iVar24 = 0;
        do {
          rimg.data = (uchar *)0x0;
          rimg.flags = 0x3010000;
          rimg._8_8_ = &canvas;
          local_b68[1] = 0;
          local_b6c = canvas.rows;
          img_1.flags = 0;
          img_1.dims = 0;
          img_1.rows = 0;
          img_1.cols = 0x406fe000;
          img_1.data = (uchar *)0x0;
          img_1.datastart = (uchar *)0x0;
          local_b78[2] = iVar24;
          local_b68[0] = iVar24;
          cv::line(&rimg,local_b68,local_b78 + 2,&img_1,1,8,0);
          rimg.data = (uchar *)0x0;
          rimg.flags = 0x3010000;
          rimg._8_8_ = &canvas_orig;
          local_b78[1] = 0;
          local_b7c = canvas_orig.rows;
          img_1.flags = 0;
          img_1.dims = 0;
          img_1.rows = 0;
          img_1.cols = 0x406fe000;
          img_1.data = (uchar *)0x0;
          img_1.datastart = (uchar *)0x0;
          local_b80 = iVar24;
          local_b78[0] = iVar24;
          cv::line(&rimg,local_b78,&local_b80,&img_1,1,8,0);
          iVar24 = iVar24 + 0x10;
        } while (iVar24 < canvas.cols);
      }
      ppuVar1 = &img_1.data;
      img_1._0_8_ = ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&img_1,"rectified","");
      rimg.data = (uchar *)0x0;
      rimg.flags = 0x1010000;
      rimg._8_8_ = &canvas;
      cv::imshow((string *)&img_1,(_InputArray *)&rimg);
      if ((uchar **)img_1._0_8_ != ppuVar1) {
        operator_delete((void *)img_1._0_8_);
      }
      img_1._0_8_ = ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&img_1,"unrectified","");
      rimg.data = (uchar *)0x0;
      rimg.flags = 0x1010000;
      rimg._8_8_ = &canvas_orig;
      cv::imshow((string *)&img_1,(_InputArray *)&rimg);
      if ((uchar **)img_1._0_8_ != ppuVar1) {
        operator_delete((void *)img_1._0_8_);
      }
      bVar8 = cv::waitKey(0);
      if ((bVar8 == 0x1b) || ((bVar8 & 0xdf) == 0x51)) break;
      uVar16 = local_b90 + 1;
      dVar19 = (double)((long)local_b88 + 0x40);
    } while (uVar16 != uVar25);
    cv::Mat::~Mat(&canvas_orig);
    cv::Mat::~Mat(&canvas);
    lVar17 = 0x120;
    do {
      cv::Mat::~Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                           lVar17 + 0xffffffffffffffb8U));
      lVar17 = lVar17 + -0x60;
    } while (lVar17 != -0x60);
  }
  cv::Mat::~Mat(&Q);
  cv::Mat::~Mat(&P2);
  cv::Mat::~Mat(&P1);
  cv::Mat::~Mat(&R2);
  cv::Mat::~Mat(&R1);
  cv::FileStorage::~FileStorage(&fs);
  lVar17 = 0x18;
  do {
    pvVar6 = *(void **)((long)&lines[0].
                               super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6);
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  cv::Mat::~Mat(&F);
  cv::Mat::~Mat(&E);
  cv::Mat::~Mat(&T);
  cv::Mat::~Mat(&R);
  lVar17 = 0x60;
  do {
    cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&distCoeffs[0].step + -3))->step + -3))->step +
                                0xfffffffffffffffd) + lVar17));
    lVar17 = lVar17 + -0x60;
  } while (lVar17 != -0x60);
  lVar17 = 0x60;
  do {
    cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&cameraMatrix[0].step + -3))->step + -3))->step
                                + 0xfffffffffffffffd) + lVar17));
    lVar17 = lVar17 + -0x60;
  } while (lVar17 != -0x60);
LAB_0010739d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&goodImageList);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::~vector(&objectPoints);
  lVar17 = 0x18;
  do {
    std::
    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *)((long)&imagePoints[0].
                         super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  return;
LAB_001050a7:
  putchar(0x2e);
  bVar27 = cVar7 != '\0';
  if (bVar27) {
    cameraMatrix[0].data = (uchar *)0x0;
    cameraMatrix[0].flags = 0x1010000;
    cameraMatrix[0]._8_8_ = rmap;
    distCoeffs[0].data = (uchar *)0x0;
    distCoeffs[0].flags = -0x7cfcfff3;
    local_7a8[2] = 0xb0000000b;
    local_7a8[1] = 0xffffffffffffffff;
    distCoeffs[0]._8_8_ = pvVar22;
    cv::cornerSubPix(0x47ae147b,cameraMatrix,distCoeffs,local_7a8 + 2,local_7a8 + 1,0x1e00000003);
  }
LAB_0010515a:
  cv::Mat::~Mat(rmap[0]);
  if (!bVar27) {
    iVar24 = (int)lVar17;
    goto LAB_001051dc;
  }
  bVar27 = lVar17 != 0;
  lVar17 = lVar17 + 1;
  if (bVar27) goto LAB_001051d7;
  goto LAB_00104dc6;
LAB_001051d7:
  iVar24 = 2;
LAB_001051dc:
  if (iVar24 == 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&goodImageList,
                (imagelist->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + (long)dVar11 * 2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&goodImageList,
                (imagelist->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + (long)local_bc8 * 2 + 1);
    uVar9 = uVar9 + 1;
  }
  dVar11 = (double)((long)local_bc8 + 1);
  if (dVar11 == dVar19) goto LAB_0010527b;
  goto LAB_00104da5;
}

Assistant:

static void
StereoCalib(const vector<string>& imagelist, Size boardSize, float squareSize, bool displayCorners = false, bool useCalibrated=true, bool showRectified=true)
{
    if( imagelist.size() % 2 != 0 )
    {
        cout << "Error: the image list contains odd (non-even) number of elements\n";
        return;
    }

    const int maxScale = 2;
    // ARRAY AND VECTOR STORAGE:

    vector<vector<Point2f> > imagePoints[2];
    vector<vector<Point3f> > objectPoints;
    Size imageSize;

    int i, j, k, nimages = (int)imagelist.size()/2;

    imagePoints[0].resize(nimages);
    imagePoints[1].resize(nimages);
    vector<string> goodImageList;

    for( i = j = 0; i < nimages; i++ )
    {
        for( k = 0; k < 2; k++ )
        {
            const string& filename = imagelist[i*2+k];
            Mat img = imread(filename, 0);
            if(img.empty())
                break;
            if( imageSize == Size() )
                imageSize = img.size();
            else if( img.size() != imageSize )
            {
                cout << "The image " << filename << " has the size different from the first image size. Skipping the pair\n";
                break;
            }
            bool found = false;
            vector<Point2f>& corners = imagePoints[k][j];
            for( int scale = 1; scale <= maxScale; scale++ )
            {
                Mat timg;
                if( scale == 1 )
                    timg = img;
                else
                    resize(img, timg, Size(), scale, scale, INTER_LINEAR_EXACT);
                found = findChessboardCorners(timg, boardSize, corners,
                    CALIB_CB_ADAPTIVE_THRESH | CALIB_CB_NORMALIZE_IMAGE);
                if( found )
                {
                    if( scale > 1 )
                    {
                        Mat cornersMat(corners);
                        cornersMat *= 1./scale;
                    }
                    break;
                }
            }
            if( displayCorners )
            {
                cout << filename << endl;
                Mat cimg, cimg1;
                cvtColor(img, cimg, COLOR_GRAY2BGR);
                drawChessboardCorners(cimg, boardSize, corners, found);
                double sf = 640./MAX(img.rows, img.cols);
                resize(cimg, cimg1, Size(), sf, sf, INTER_LINEAR_EXACT);
                imshow("corners", cimg1);
                char c = (char)waitKey(500);
                if( c == 27 || c == 'q' || c == 'Q' ) //Allow ESC to quit
                    exit(-1);
            }
            else
                putchar('.');
            if( !found )
                break;
            cornerSubPix(img, corners, Size(11,11), Size(-1,-1),
                         TermCriteria(TermCriteria::COUNT+TermCriteria::EPS,
                                      30, 0.01));
        }
        if( k == 2 )
        {
            goodImageList.push_back(imagelist[i*2]);
            goodImageList.push_back(imagelist[i*2+1]);
            j++;
        }
    }
    cout << j << " pairs have been successfully detected.\n";
    nimages = j;
    if( nimages < 2 )
    {
        cout << "Error: too little pairs to run the calibration\n";
        return;
    }

    imagePoints[0].resize(nimages);
    imagePoints[1].resize(nimages);
    objectPoints.resize(nimages);

    for( i = 0; i < nimages; i++ )
    {
        for( j = 0; j < boardSize.height; j++ )
            for( k = 0; k < boardSize.width; k++ )
                objectPoints[i].push_back(Point3f(k*squareSize, j*squareSize, 0));
    }

    cout << "Running stereo calibration ...\n";

    Mat cameraMatrix[2], distCoeffs[2];
    cameraMatrix[0] = initCameraMatrix2D(objectPoints,imagePoints[0],imageSize,0);
    cameraMatrix[1] = initCameraMatrix2D(objectPoints,imagePoints[1],imageSize,0);
    Mat R, T, E, F;

    double rms = stereoCalibrate(objectPoints, imagePoints[0], imagePoints[1],
                    cameraMatrix[0], distCoeffs[0],
                    cameraMatrix[1], distCoeffs[1],
                    imageSize, R, T, E, F,
                    CALIB_FIX_ASPECT_RATIO +
                    CALIB_ZERO_TANGENT_DIST +
                    CALIB_USE_INTRINSIC_GUESS +
                    CALIB_SAME_FOCAL_LENGTH +
                    CALIB_RATIONAL_MODEL +
                    CALIB_FIX_K3 + CALIB_FIX_K4 + CALIB_FIX_K5,
                    TermCriteria(TermCriteria::COUNT+TermCriteria::EPS, 100, 1e-5) );
    cout << "done with RMS error=" << rms << endl;

// CALIBRATION QUALITY CHECK
// because the output fundamental matrix implicitly
// includes all the output information,
// we can check the quality of calibration using the
// epipolar geometry constraint: m2^t*F*m1=0
    double err = 0;
    int npoints = 0;
    vector<Vec3f> lines[2];
    for( i = 0; i < nimages; i++ )
    {
        int npt = (int)imagePoints[0][i].size();
        Mat imgpt[2];
        for( k = 0; k < 2; k++ )
        {
            imgpt[k] = Mat(imagePoints[k][i]);
            undistortPoints(imgpt[k], imgpt[k], cameraMatrix[k], distCoeffs[k], Mat(), cameraMatrix[k]);
            computeCorrespondEpilines(imgpt[k], k+1, F, lines[k]);
        }
        for( j = 0; j < npt; j++ )
        {
            double errij = fabs(imagePoints[0][i][j].x*lines[1][j][0] +
                                imagePoints[0][i][j].y*lines[1][j][1] + lines[1][j][2]) +
                           fabs(imagePoints[1][i][j].x*lines[0][j][0] +
                                imagePoints[1][i][j].y*lines[0][j][1] + lines[0][j][2]);
            err += errij;
        }
        npoints += npt;
    }
    cout << "average epipolar err = " <<  err/npoints << endl;

    // save intrinsic parameters
    FileStorage fs("intrinsics.yml", FileStorage::WRITE);
    if( fs.isOpened() )
    {
        fs << "M1" << cameraMatrix[0] << "D1" << distCoeffs[0] <<
            "M2" << cameraMatrix[1] << "D2" << distCoeffs[1];
        fs.release();
    }
    else
        cout << "Error: can not save the intrinsic parameters\n";

    Mat R1, R2, P1, P2, Q;
    Rect validRoi[2];

    stereoRectify(cameraMatrix[0], distCoeffs[0],
                  cameraMatrix[1], distCoeffs[1],
                  imageSize, R, T, R1, R2, P1, P2, Q,
                  CALIB_ZERO_DISPARITY, 1, imageSize, &validRoi[0], &validRoi[1]);

    fs.open("extrinsics.yml", FileStorage::WRITE);
    if( fs.isOpened() )
    {
        fs << "R" << R << "T" << T << "R1" << R1 << "R2" << R2 << "P1" << P1 << "P2" << P2 << "Q" << Q;
        fs.release();
    }
    else
        cout << "Error: can not save the extrinsic parameters\n";

    // OpenCV can handle left-right
    // or up-down camera arrangements
    bool isVerticalStereo = fabs(P2.at<double>(1, 3)) > fabs(P2.at<double>(0, 3));

// COMPUTE AND DISPLAY RECTIFICATION
    if( !showRectified )
        return;

    Mat rmap[2][2];
// IF BY CALIBRATED (BOUGUET'S METHOD)
    if( useCalibrated )
    {
        // we already computed everything
    }
// OR ELSE HARTLEY'S METHOD
    else
 // use intrinsic parameters of each camera, but
 // compute the rectification transformation directly
 // from the fundamental matrix
    {
        vector<Point2f> allimgpt[2];
        for( k = 0; k < 2; k++ )
        {
            for( i = 0; i < nimages; i++ )
                std::copy(imagePoints[k][i].begin(), imagePoints[k][i].end(), back_inserter(allimgpt[k]));
        }
        F = findFundamentalMat(Mat(allimgpt[0]), Mat(allimgpt[1]), FM_8POINT, 0, 0);
        Mat H1, H2;
        stereoRectifyUncalibrated(Mat(allimgpt[0]), Mat(allimgpt[1]), F, imageSize, H1, H2, 3);

        R1 = cameraMatrix[0].inv()*H1*cameraMatrix[0];
        R2 = cameraMatrix[1].inv()*H2*cameraMatrix[1];
        P1 = cameraMatrix[0];
        P2 = cameraMatrix[1];
    }

    //Precompute maps for cv::remap()
    initUndistortRectifyMap(cameraMatrix[0], distCoeffs[0], R1, P1, imageSize, CV_16SC2, rmap[0][0], rmap[0][1]);
    initUndistortRectifyMap(cameraMatrix[1], distCoeffs[1], R2, P2, imageSize, CV_16SC2, rmap[1][0], rmap[1][1]);

    Mat canvas;
    Mat canvas_orig;
    double sf;
    int w, h;
    if( !isVerticalStereo )
    {
        sf = 600./MAX(imageSize.width, imageSize.height);
        w = cvRound(imageSize.width*sf);
        h = cvRound(imageSize.height*sf);
        canvas.create(h, w*2, CV_8UC3);
        canvas_orig.create(h, w*2, CV_8UC3);
    }
    else
    {
        sf = 300./MAX(imageSize.width, imageSize.height);
        w = cvRound(imageSize.width*sf);
        h = cvRound(imageSize.height*sf);
        canvas.create(h*2, w, CV_8UC3);
        canvas_orig.create(h*2, w, CV_8UC3);
    }

    for( i = 0; i < nimages; i++ )
    {
        for( k = 0; k < 2; k++ )
        {
            Mat img = imread(goodImageList[i*2+k], 0), rimg, cimg, gimg;
            remap(img, rimg, rmap[k][0], rmap[k][1], INTER_LINEAR);
            cvtColor(rimg, cimg, COLOR_GRAY2BGR);
            cvtColor(img, gimg, COLOR_GRAY2BGR);
            Mat canvasPart = !isVerticalStereo ? canvas(Rect(w*k, 0, w, h)) : canvas(Rect(0, h*k, w, h));
            Mat canvasPart_orig = !isVerticalStereo ? canvas_orig(Rect(w*k, 0, w, h)) : canvas_orig(Rect(0, h*k, w, h));
            resize(cimg, canvasPart, canvasPart.size(), 0, 0, INTER_AREA);
            resize(gimg, canvasPart_orig, canvasPart_orig.size(), 0, 0, INTER_AREA);
            if( useCalibrated )
            {
                Rect vroi(cvRound(validRoi[k].x*sf), cvRound(validRoi[k].y*sf),
                          cvRound(validRoi[k].width*sf), cvRound(validRoi[k].height*sf));
                rectangle(canvasPart, vroi, Scalar(0,0,255), 3, 8);
                rectangle(canvasPart_orig, vroi, Scalar(0,0,255), 3, 8);
            }
        }

        if( !isVerticalStereo )
            for( j = 0; j < canvas.rows; j += 16 )
            {
                line(canvas, Point(0, j), Point(canvas.cols, j), Scalar(0, 255, 0), 1, 8);
                line(canvas_orig, Point(0, j), Point(canvas_orig.cols, j), Scalar(0, 255, 0), 1, 8);
            }
        else
            for( j = 0; j < canvas.cols; j += 16 )
            {
                line(canvas, Point(j, 0), Point(j, canvas.rows), Scalar(0, 255, 0), 1, 8);
                line(canvas_orig, Point(j, 0), Point(j, canvas_orig.rows), Scalar(0, 255, 0), 1, 8);
            }
        imshow("rectified", canvas);
        imshow("unrectified", canvas_orig);
        char c = (char)waitKey();
        if( c == 27 || c == 'q' || c == 'Q' )
            break;
    }
}